

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_info.cc
# Opt level: O2

void __thiscall pstack::Dwarf::Abbreviation::Abbreviation(Abbreviation *this,DWARFReader *r)

{
  uint8_t uVar1;
  uintmax_t uVar2;
  intmax_t local_50;
  intmax_t value;
  int iStack_40;
  Form form;
  AttrName local_34 [2];
  AttrName name;
  
  uVar2 = DWARFReader::getuleb128(r);
  this->tag = (Tag)uVar2;
  uVar1 = DWARFReader::getu8(r);
  this->hasChildren = uVar1 == '\x01';
  this->sorted = false;
  (this->forms).
  super__Vector_base<pstack::Dwarf::FormEntry,_std::allocator<pstack::Dwarf::FormEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->forms).
  super__Vector_base<pstack::Dwarf::FormEntry,_std::allocator<pstack::Dwarf::FormEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->forms).
  super__Vector_base<pstack::Dwarf::FormEntry,_std::allocator<pstack::Dwarf::FormEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->nextSibIdx = -1;
  (this->attrName2Idx).
  super__Vector_base<std::pair<pstack::Dwarf::AttrName,_unsigned_long>,_std::allocator<std::pair<pstack::Dwarf::AttrName,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attrName2Idx).
  super__Vector_base<std::pair<pstack::Dwarf::AttrName,_unsigned_long>,_std::allocator<std::pair<pstack::Dwarf::AttrName,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->attrName2Idx).
  super__Vector_base<std::pair<pstack::Dwarf::AttrName,_unsigned_long>,_std::allocator<std::pair<pstack::Dwarf::AttrName,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _iStack_40 = 0;
  while( true ) {
    uVar2 = DWARFReader::getuleb128(r);
    local_34[0] = (AttrName)uVar2;
    uVar2 = DWARFReader::getuleb128(r);
    value._4_4_ = (int)uVar2;
    if (local_34[0] == DW_AT_none && value._4_4_ == 0) break;
    if (local_34[0] == DW_AT_sibling) {
      this->nextSibIdx = iStack_40;
    }
    if (value._4_4_ == 0x21) {
      local_50 = DWARFReader::getsleb128(r);
    }
    else {
      local_50 = 0;
    }
    std::vector<pstack::Dwarf::FormEntry,std::allocator<pstack::Dwarf::FormEntry>>::
    emplace_back<pstack::Dwarf::Form&,long&>
              ((vector<pstack::Dwarf::FormEntry,std::allocator<pstack::Dwarf::FormEntry>> *)
               &this->forms,(Form *)((long)&value + 4),&local_50);
    std::
    vector<std::pair<pstack::Dwarf::AttrName,unsigned_long>,std::allocator<std::pair<pstack::Dwarf::AttrName,unsigned_long>>>
    ::emplace_back<pstack::Dwarf::AttrName&,unsigned_long&>
              ((vector<std::pair<pstack::Dwarf::AttrName,unsigned_long>,std::allocator<std::pair<pstack::Dwarf::AttrName,unsigned_long>>>
                *)&this->attrName2Idx,local_34,(unsigned_long *)&stack0xffffffffffffffc0);
    _iStack_40 = _iStack_40 + 1;
  }
  return;
}

Assistant:

Abbreviation::Abbreviation(DWARFReader &r)
    : tag(Tag(r.getuleb128()))
    , hasChildren(HasChildren(r.getu8()) == DW_CHILDREN_yes)
    , sorted(false)
    , nextSibIdx(-1)
{
    for (size_t i = 0;; ++i) {
        auto name = AttrName(r.getuleb128());
        auto form = Form(r.getuleb128());
        if (name == 0 && form == 0)
            break;
        if (name == DW_AT_sibling)
            nextSibIdx = int(i);
        intmax_t value = (form == DW_FORM_implicit_const) ? r.getsleb128() : 0;
        forms.emplace_back(form, value);
        attrName2Idx.emplace_back(name, i);
    }
}